

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O1

int SUNNonlinSolSetSysFn_FixedPoint(SUNNonlinearSolver NLS,SUNNonlinSolSysFn SysFn)

{
  if (NLS == (SUNNonlinearSolver)0x0) {
    return -1;
  }
  if (SysFn != (SUNNonlinSolSysFn)0x0) {
    *(SUNNonlinSolSysFn *)NLS->content = SysFn;
    return 0;
  }
  return -3;
}

Assistant:

int SUNNonlinSolSetSysFn_FixedPoint(SUNNonlinearSolver NLS, SUNNonlinSolSysFn SysFn)
{
  /* check that the nonlinear solver is non-null */
  if (NLS == NULL)
    return(SUN_NLS_MEM_NULL);

  /* check that the nonlinear system function is non-null */
  if (SysFn == NULL)
    return(SUN_NLS_ILL_INPUT);

  FP_CONTENT(NLS)->Sys = SysFn;
  return(SUN_NLS_SUCCESS);
}